

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

void __thiscall Arcflow::build(Arcflow *this)

{
  NodeSet *this_00;
  pointer pAVar1;
  runtime_error *this_01;
  _Vector_base<int,_std::allocator<int>_> *this_02;
  allocator_type local_159;
  _Vector_base<int,_std::allocator<int>_> local_158;
  _Vector_base<int,_std::allocator<int>_> local_140;
  char _error_msg_ [256];
  
  if (this->ready == false) {
    std::
    _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::clear(&(this->dp)._M_t);
    pAVar1 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if ((this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
        _M_finish != pAVar1) {
      (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
      _M_finish = pAVar1;
    }
    this_00 = &this->NS;
    NodeSet::clear(this_00);
    if ((this->inst).binary == true) {
      _error_msg_[0] = '\0';
      _error_msg_[1] = '\0';
      _error_msg_[2] = '\0';
      _error_msg_[3] = '\0';
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_140,(long)this->label_size,
                 (value_type_conflict *)_error_msg_,&local_159);
      go(this);
      this_02 = &local_140;
    }
    else {
      _error_msg_[0] = '\0';
      _error_msg_[1] = '\0';
      _error_msg_[2] = '\0';
      _error_msg_[3] = '\0';
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_158,(long)(this->label_size + 2),
                 (value_type_conflict *)_error_msg_,&local_159);
      go(this);
      this_02 = &local_158;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_02);
    printf("  #dp: %d\n",(ulong)(uint)(this->dp)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::clear(&(this->dp)._M_t);
    std::vector<Arc,std::allocator<Arc>>::_M_assign_aux<std::_Rb_tree_const_iterator<Arc>>
              ((vector<Arc,std::allocator<Arc>> *)&this->A,
               (this->AS)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(this->AS)._M_t._M_impl.super__Rb_tree_header);
    std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::clear
              (&(this->AS)._M_t);
    NodeSet::topological_order((vector<int,_std::allocator<int>_> *)_error_msg_,this_00);
    relabel_graph(this,(vector<int,_std::allocator<int>_> *)_error_msg_);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
    NodeSet::sort(this_00);
    return;
  }
  snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == false",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x168);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,_error_msg_);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::build() {
	throw_assert(ready == false);
	dp.clear();
	A.clear();
	NS.clear();

	if (inst.binary) {
		go(std::vector<int>(label_size, 0));
	} else {
		go(std::vector<int>(label_size + 2, 0));
	}

	printf("  #dp: %d\n", static_cast<int>(dp.size()));

	dp.clear();
	A.assign(all(AS));
	AS.clear();

	relabel_graph(NS.topological_order());
	NS.sort();
}